

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::log_contexts(XmlReporter *this)

{
  undefined1 *local_248;
  allocator local_231;
  string local_230 [32];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  undefined1 local_1c8 [36];
  int i;
  stringstream ss;
  undefined1 auStack_198 [376];
  IContextScope **local_20;
  IContextScope **contexts;
  XmlReporter *pXStack_10;
  int num_contexts;
  XmlReporter *this_local;
  
  pXStack_10 = this;
  contexts._4_4_ = IReporter::get_num_active_contexts();
  if (contexts._4_4_ != 0) {
    local_20 = IReporter::get_active_contexts();
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x20));
    for (local_1c8._28_4_ = 0; (int)local_1c8._28_4_ < contexts._4_4_;
        local_1c8._28_4_ = local_1c8._28_4_ + 1) {
      local_248 = (undefined1 *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1a8) {
        local_248 = auStack_198;
      }
      (*local_20[(int)local_1c8._28_4_]->_vptr_IContextScope[2])
                (local_20[(int)local_1c8._28_4_],local_248);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"Info",&local_1e9);
      XmlWriter::scopedElement((XmlWriter *)local_1c8,(string *)&this->xml);
      std::__cxx11::stringstream::str();
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_1c8,local_210,true);
      std::__cxx11::string::~string((string *)local_210);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1c8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"",&local_231);
      std::__cxx11::stringstream::str((string *)(local_1c8 + 0x20));
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x20));
  }
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto              contexts = get_active_contexts();
                std::stringstream ss;
                for(int i = 0; i < num_contexts; ++i) {
                    contexts[i]->stringify(&ss);
                    xml.scopedElement("Info").writeText(ss.str());
                    ss.str("");
                }
            }
        }